

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setArchName(Triple *this,StringRef Str)

{
  Twine local_f8;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  char *local_a0;
  size_t local_98;
  undefined1 local_90 [8];
  SmallString<64U> Triple;
  Triple *this_local;
  StringRef Str_local;
  
  Triple.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts._56_8_ = this;
  SmallString<64U>::SmallString((SmallString<64U> *)local_90);
  local_a0 = Str.Data;
  local_98 = Str.Length;
  SmallString<64U>::operator+=((SmallString<64U> *)local_90,Str);
  strlen("-");
  SmallString<64U>::operator+=((SmallString<64U> *)local_90,local_b0);
  local_c0 = getVendorName(this);
  SmallString<64U>::operator+=((SmallString<64U> *)local_90,local_c0);
  strlen("-");
  SmallString<64U>::operator+=((SmallString<64U> *)local_90,local_d0);
  local_e0 = getOSAndEnvironmentName(this);
  SmallString<64U>::operator+=((SmallString<64U> *)local_90,local_e0);
  Twine::Twine(&local_f8,(SmallVectorImpl<char> *)local_90);
  setTriple(this,&local_f8);
  SmallString<64U>::~SmallString((SmallString<64U> *)local_90);
  return;
}

Assistant:

void Triple::setArchName(StringRef Str) {
  // Work around a miscompilation bug for Twines in gcc 4.0.3.
  SmallString<64> Triple;
  Triple += Str;
  Triple += "-";
  Triple += getVendorName();
  Triple += "-";
  Triple += getOSAndEnvironmentName();
  setTriple(Triple);
}